

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTextureNonProjected
               (SurfaceAccess *dst,Texture1DArrayView *rawSrc,Vec4 *sq,Vec4 *tq,
               ReferenceParams *params)

{
  float fVar1;
  int iVar2;
  int y_;
  float *pfVar3;
  float fVar4;
  Texture1DArrayView TVar5;
  float local_178;
  float local_174;
  float local_134;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vec4 local_f8;
  float local_e8;
  float local_e4;
  float lod;
  float t;
  float s;
  float triY;
  float triX;
  int triNdx;
  float xf;
  float yf;
  int x;
  int y;
  float triLod [2];
  Vec3 triT [2];
  undefined1 local_98 [8];
  Vec3 triS [2];
  deInt32 srcSize;
  IVec2 dstSize;
  float lodBias;
  undefined1 local_58 [8];
  Texture1DArrayView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *params_local;
  Vec4 *tq_local;
  Vec4 *sq_local;
  Texture1DArrayView *rawSrc_local;
  SurfaceAccess *dst_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar5 = tcu::getEffectiveTextureView
                    (rawSrc,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             *)&src.m_levels,&params->sampler);
  src._0_8_ = TVar5.m_levels;
  local_58._0_4_ = TVar5.m_numLevels;
  if (((params->super_RenderParams).flags & 2) == 0) {
    local_134 = 0.0;
  }
  else {
    local_134 = (params->super_RenderParams).bias;
  }
  dstSize.m_data[0] = (int)local_134;
  iVar2 = tcu::SurfaceAccess::getWidth(dst);
  y_ = tcu::SurfaceAccess::getHeight(dst);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffff90,iVar2,y_);
  iVar2 = tcu::Texture1DArrayView::getWidth((Texture1DArrayView *)local_58);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_98,(int)sq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)sq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)triLod,(int)tq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)tq,3,2);
  fVar4 = computeNonProjectedTriLod
                    (params->lodMode,(IVec2 *)&stack0xffffffffffffff90,iVar2,(Vec3 *)local_98);
  x = (int)(fVar4 + (float)dstSize.m_data[0]);
  fVar4 = computeNonProjectedTriLod
                    (params->lodMode,(IVec2 *)&stack0xffffffffffffff90,iVar2,
                     (Vec3 *)(triS[0].m_data + 1));
  y = (int)(fVar4 + (float)dstSize.m_data[0]);
  for (yf = 0.0; fVar4 = yf, iVar2 = tcu::SurfaceAccess::getHeight(dst), (int)fVar4 < iVar2;
      yf = (float)((int)yf + 1)) {
    for (xf = 0.0; fVar4 = xf, iVar2 = tcu::SurfaceAccess::getWidth(dst), (int)fVar4 < iVar2;
        xf = (float)((int)xf + 1)) {
      fVar4 = (float)(int)yf;
      iVar2 = tcu::SurfaceAccess::getHeight(dst);
      triNdx = (int)((fVar4 + 0.5) / (float)iVar2);
      fVar4 = (float)(int)xf;
      iVar2 = tcu::SurfaceAccess::getWidth(dst);
      triX = (fVar4 + 0.5) / (float)iVar2;
      triY = (float)(uint)(1.0 <= triX + (float)triNdx);
      local_174 = triX;
      if (triY != 0.0) {
        local_174 = 1.0 - triX;
      }
      s = local_174;
      if (triY == 0.0) {
        local_178 = (float)triNdx;
      }
      else {
        local_178 = 1.0 - (float)triNdx;
      }
      t = local_178;
      pfVar3 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(triS[(long)(int)triY + -1].m_data + 1))
      ;
      fVar4 = *pfVar3;
      pfVar3 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(triS[(long)(int)triY + -1].m_data + 1))
      ;
      fVar1 = *pfVar3;
      pfVar3 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(triS[(long)(int)triY + -1].m_data + 1))
      ;
      lod = triangleInterpolate(fVar4,fVar1,*pfVar3,s,t);
      pfVar3 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(triT[(long)(int)triY + -1].m_data + 1))
      ;
      fVar4 = *pfVar3;
      pfVar3 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(triT[(long)(int)triY + -1].m_data + 1))
      ;
      fVar1 = *pfVar3;
      pfVar3 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(triT[(long)(int)triY + -1].m_data + 1))
      ;
      local_e4 = triangleInterpolate(fVar4,fVar1,*pfVar3,s,t);
      local_e8 = (float)(&x)[(int)triY];
      execSample((TextureTestUtil *)&local_118,(Texture1DArrayView *)local_58,params,lod,local_e4,
                 local_e8);
      tcu::operator*((tcu *)&local_108,&local_118,&(params->super_RenderParams).colorScale);
      tcu::operator+((tcu *)&local_f8,&local_108,&(params->super_RenderParams).colorBias);
      tcu::SurfaceAccess::setPixel(dst,&local_f8,(int)xf,(int)yf);
    }
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  return;
}

Assistant:

static void sampleTextureNonProjected (const tcu::SurfaceAccess& dst, const tcu::Texture1DArrayView& rawSrc, const tcu::Vec4& sq, const tcu::Vec4& tq, const ReferenceParams& params)
{
	// Separate combined DS formats
	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DArrayView				src					= getEffectiveTextureView(rawSrc, srcLevelStorage, params.sampler);

	float										lodBias				= (params.flags & ReferenceParams::USE_BIAS) ? params.bias : 0.0f;

	tcu::IVec2									dstSize				= tcu::IVec2(dst.getWidth(), dst.getHeight());
	deInt32										srcSize				= src.getWidth();

	// Coordinates and lod per triangle.
	tcu::Vec3									triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	tcu::Vec3									triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	float										triLod[2]			= { computeNonProjectedTriLod(params.lodMode, dstSize, srcSize, triS[0]) + lodBias,
																		computeNonProjectedTriLod(params.lodMode, dstSize, srcSize, triS[1]) + lodBias};

	for (int y = 0; y < dst.getHeight(); y++)
	{
		for (int x = 0; x < dst.getWidth(); x++)
		{
			float	yf		= ((float)y + 0.5f) / (float)dst.getHeight();
			float	xf		= ((float)x + 0.5f) / (float)dst.getWidth();

			int		triNdx	= xf + yf >= 1.0f ? 1 : 0; // Top left fill rule.
			float	triX	= triNdx ? 1.0f-xf : xf;
			float	triY	= triNdx ? 1.0f-yf : yf;

			float	s		= triangleInterpolate(triS[triNdx].x(), triS[triNdx].y(), triS[triNdx].z(), triX, triY);
			float	t		= triangleInterpolate(triT[triNdx].x(), triT[triNdx].y(), triT[triNdx].z(), triX, triY);
			float	lod		= triLod[triNdx];

			dst.setPixel(execSample(src, params, s, t, lod) * params.colorScale + params.colorBias, x, y);
		}
	}
}